

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3MatchEName(ExprList_item *pItem,char *zCol,char *zTab,char *zDb,int *pbRowid)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ushort uVar8;
  byte *pbVar9;
  long lVar10;
  uchar uVar11;
  ulong uVar12;
  uchar uVar13;
  
  uVar8 = *(ushort *)&(pItem->fg).field_0x1 & 3;
  if (uVar8 != 2) {
    if (pbRowid == (int *)0x0) {
      return 0;
    }
    if (uVar8 != 3) {
      return 0;
    }
  }
  uVar7 = 1;
  pbVar4 = (byte *)pItem->zEName;
  while( true ) {
    pbVar3 = pbVar4 + 1;
    if ((*pbVar4 == 0) || (*pbVar4 == 0x2e)) break;
    uVar7 = uVar7 + 1;
    pbVar4 = pbVar3;
  }
  if (zDb == (char *)0x0) {
LAB_00182ff2:
    uVar7 = 1;
    for (pbVar4 = pbVar4 + 2; (pbVar4[-1] != 0 && (pbVar4[-1] != 0x2e)); pbVar4 = pbVar4 + 1) {
      uVar7 = uVar7 + 1;
    }
    if (zTab != (char *)0x0) {
      if (uVar7 != 1) {
        uVar6 = uVar7 & 0xffffffff;
        pbVar9 = (byte *)zTab;
        do {
          if ((ulong)*pbVar3 == 0) {
            uVar13 = ""[*pbVar9];
            uVar11 = '\0';
LAB_00183061:
            if (uVar11 != uVar13) goto LAB_00183070;
            break;
          }
          uVar11 = ""[*pbVar3];
          uVar13 = ""[*pbVar9];
          if (uVar11 != uVar13) goto LAB_00183061;
          pbVar3 = pbVar3 + 1;
          pbVar9 = pbVar9 + 1;
          uVar5 = (int)uVar6 - 1;
          uVar6 = (ulong)uVar5;
        } while (1 < uVar5);
      }
      if (zTab[uVar7 - 1] != '\0') goto LAB_00183070;
    }
    if (zCol == (char *)0x0) {
      if (uVar8 != 3) {
        return 1;
      }
    }
    else {
      if (uVar8 != 3) {
        if (uVar8 != 2) {
          return 1;
        }
        do {
          bVar1 = *pbVar4;
          if (bVar1 == *zCol) {
            if ((ulong)bVar1 == 0) {
              return 1;
            }
          }
          else if (""[bVar1] != ""[(byte)*zCol]) goto LAB_00183070;
          zCol = (char *)((byte *)zCol + 1);
          pbVar4 = pbVar4 + 1;
        } while( true );
      }
      iVar2 = sqlite3IsRowid(zCol);
      if (iVar2 == 0) goto LAB_00183070;
    }
    *pbRowid = 1;
    iVar2 = 1;
  }
  else {
    if (uVar7 != 1) {
      lVar10 = 0;
      uVar6 = uVar7 & 0xffffffff;
      do {
        uVar12 = (ulong)(byte)pItem->zEName[lVar10];
        if (uVar12 == 0) {
          uVar13 = ""[(byte)zDb[lVar10]];
          uVar11 = '\0';
LAB_00182fde:
          if (uVar11 != uVar13) goto LAB_00183070;
          break;
        }
        uVar11 = ""[uVar12];
        uVar13 = ""[(byte)zDb[lVar10]];
        if (uVar11 != uVar13) goto LAB_00182fde;
        uVar5 = (int)uVar6 - 1;
        uVar6 = (ulong)uVar5;
        lVar10 = lVar10 + 1;
      } while (1 < uVar5);
    }
    if (zDb[uVar7 - 1] == '\0') goto LAB_00182ff2;
LAB_00183070:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3MatchEName(
  const struct ExprList_item *pItem,
  const char *zCol,
  const char *zTab,
  const char *zDb,
  int *pbRowid
){
  int n;
  const char *zSpan;
  int eEName = pItem->fg.eEName;
  if( eEName!=ENAME_TAB && (eEName!=ENAME_ROWID || NEVER(pbRowid==0)) ){
    return 0;
  }
  assert( pbRowid==0 || *pbRowid==0 );
  zSpan = pItem->zEName;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zDb && (sqlite3StrNICmp(zSpan, zDb, n)!=0 || zDb[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zTab && (sqlite3StrNICmp(zSpan, zTab, n)!=0 || zTab[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  if( zCol ){
    if( eEName==ENAME_TAB && sqlite3StrICmp(zSpan, zCol)!=0 ) return 0;
    if( eEName==ENAME_ROWID && sqlite3IsRowid(zCol)==0 ) return 0;
  }
  if( eEName==ENAME_ROWID ) *pbRowid = 1;
  return 1;
}